

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

void Extra_ThreshPrintInequalities
               (unsigned_long **pGreaters,unsigned_long **pSmallers,int nChows,int nInequalities)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (nChows < 1) {
    nChows = 0;
  }
  uVar1 = (ulong)(uint)nInequalities;
  if (nInequalities < 1) {
    uVar1 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    printf("\n Inequality [%d] = ",uVar3 & 0xffffffff);
    for (uVar2 = 0; (uint)nChows != uVar2; uVar2 = uVar2 + 1) {
      printf("%ld ",pGreaters[uVar3][uVar2]);
    }
    printf(" > ");
    for (uVar2 = 0; (uint)nChows != uVar2; uVar2 = uVar2 + 1) {
      printf("%ld ",pSmallers[uVar3][uVar2]);
    }
  }
  return;
}

Assistant:

void Extra_ThreshPrintInequalities(unsigned long ** pGreaters,
        unsigned long ** pSmallers, int nChows, int nInequalities) {
    int i = 0, k = 0;
    for (k = 0; k < nInequalities; k++) {
        printf("\n Inequality [%d] = ", k);
        for (i = 0; i < nChows; i++) {
            printf("%ld ", pGreaters[k][i]);
        }
        printf(" > ");

        for (i = 0; i < nChows; i++) {
            printf("%ld ", pSmallers[k][i]);
        }
    }
}